

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# droplayer.cpp
# Opt level: O2

UINT8 __thiscall DROPlayer::Start(DROPlayer *this)

{
  UINT8 *pUVar1;
  RESMPL_STATE *CAA;
  pointer puVar2;
  DEVFUNC_SETLOGCB p_Var3;
  DEVFUNC_OPTMASK p_Var4;
  PLAYER_EVENT_CB p_Var5;
  UINT8 UVar6;
  byte bVar7;
  UINT32 UVar8;
  long lVar9;
  size_t sVar10;
  UINT32 *pUVar11;
  pointer pDVar12;
  DEV_GEN_CFG *cfg;
  ulong uVar13;
  
  for (lVar9 = 0x79; lVar9 != 0x7c; lVar9 = lVar9 + 1) {
    pUVar1 = (this->_fileHdr).regCmdMap + lVar9 * 8 + -0x7a;
    pUVar1[0] = 0xff;
    pUVar1[1] = 0xff;
    pUVar1[2] = 0xff;
    pUVar1[3] = 0xff;
    pUVar1[4] = 0xff;
    pUVar1[5] = 0xff;
    pUVar1[6] = 0xff;
    pUVar1[7] = 0xff;
  }
  pDVar12 = (this->_devices).
            super__Vector_base<DROPlayer::DRO_CHIPDEV,_std::allocator<DROPlayer::DRO_CHIPDEV>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->_devices).
      super__Vector_base<DROPlayer::DRO_CHIPDEV,_std::allocator<DROPlayer::DRO_CHIPDEV>_>._M_impl.
      super__Vector_impl_data._M_finish != pDVar12) {
    (this->_devices).
    super__Vector_base<DROPlayer::DRO_CHIPDEV,_std::allocator<DROPlayer::DRO_CHIPDEV>_>._M_impl.
    super__Vector_impl_data._M_finish = pDVar12;
  }
  std::vector<DROPlayer::DRO_CHIPDEV,_std::allocator<DROPlayer::DRO_CHIPDEV>_>::resize
            (&this->_devices,
             (long)(this->_devTypes).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(this->_devTypes).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start);
  uVar13 = 0;
  do {
    puVar2 = (this->_devTypes).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->_devTypes).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)puVar2) <= uVar13) {
      this->_playState = this->_playState | 1;
      (*(this->super_PlayerBase)._vptr_PlayerBase[0x21])(this);
      p_Var5 = (this->super_PlayerBase)._eventCbFunc;
      if (p_Var5 != (PLAYER_EVENT_CB)0x0) {
        (*p_Var5)(&this->super_PlayerBase,(this->super_PlayerBase)._eventCbParam,'\x01',(void *)0x0)
        ;
      }
      return '\0';
    }
    pDVar12 = (this->_devices).
              super__Vector_base<DROPlayer::DRO_CHIPDEV,_std::allocator<DROPlayer::DRO_CHIPDEV>_>.
              _M_impl.super__Vector_impl_data._M_start;
    cfg = (this->_devCfgs).
          super__Vector_base<_device_generic_config,_std::allocator<_device_generic_config>_>.
          _M_impl.super__Vector_impl_data._M_start + uVar13;
    pDVar12[uVar13].base.defInf.dataPtr = (DEV_DATA *)0x0;
    pDVar12[uVar13].base.linkDev = (VGM_BASEDEV *)0x0;
    sVar10 = DeviceID2OptionID(this,(UINT32)uVar13);
    pDVar12[uVar13].optID = sVar10;
    pUVar11 = this->_devOpts[sVar10].emuCore;
    if (sVar10 == 0xffffffffffffffff) {
      cfg->emuCore = 0;
      cfg->srMode = '\0';
LAB_00112300:
      UVar8 = (this->super_PlayerBase)._outSmplRate;
    }
    else {
      cfg->emuCore = *pUVar11;
      cfg->srMode = *(UINT8 *)(pUVar11 + 2);
      UVar8 = pUVar11[3];
      if (UVar8 == 0) goto LAB_00112300;
    }
    pDVar12 = pDVar12 + uVar13;
    cfg->smplRate = UVar8;
    UVar6 = SndEmu_Start(puVar2[uVar13],cfg,(DEV_INFO *)pDVar12);
    if (UVar6 == '\0') {
      SndEmu_GetDeviceFunc((pDVar12->base).defInf.devDef,'\0','\x11',0,&pDVar12->write);
      (pDVar12->logCbData).player = this;
      (pDVar12->logCbData).chipDevID = uVar13;
      p_Var3 = ((pDVar12->base).defInf.devDef)->SetLogCB;
      if (p_Var3 != (DEVFUNC_SETLOGCB)0x0) {
        (*p_Var3)((pDVar12->base).defInf.dataPtr,SndEmuLogCB,&pDVar12->logCbData);
      }
      SetupLinkedDevices(&pDVar12->base,(SETUPLINKDEV_CB)0x0,(void *)0x0);
      if (sVar10 != 0xffffffffffffffff) {
        p_Var4 = ((pDVar12->base).defInf.devDef)->SetOptionBits;
        if (p_Var4 != (DEVFUNC_OPTMASK)0x0) {
          (*p_Var4)((pDVar12->base).defInf.dataPtr,pUVar11[4]);
        }
        this->_optDevMap[pDVar12->optID] = uVar13;
      }
      for (; pDVar12 != (pointer)0x0; pDVar12 = (pointer)(pDVar12->base).linkDev) {
        if (sVar10 == 0xffffffffffffffff) {
          UVar6 = '\0';
        }
        else {
          UVar6 = *(UINT8 *)((long)pUVar11 + 9);
          p_Var4 = ((pDVar12->base).defInf.devDef)->SetMuteMask;
          if (p_Var4 != (DEVFUNC_OPTMASK)0x0) {
            (*p_Var4)((pDVar12->base).defInf.dataPtr,pUVar11[6]);
          }
        }
        CAA = &(pDVar12->base).resmpl;
        Resmpl_SetVals(CAA,UVar6,0x100,(this->super_PlayerBase)._outSmplRate);
        puVar2 = (this->_devPanning).
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        bVar7 = puVar2[uVar13];
        if ((bVar7 & 2) != 0) {
          (pDVar12->base).resmpl.volumeL = 0;
          bVar7 = puVar2[uVar13];
        }
        if ((bVar7 & 1) != 0) {
          (pDVar12->base).resmpl.volumeR = 0;
        }
        Resmpl_DevConnect(CAA,(DEV_INFO *)pDVar12);
        Resmpl_Init(CAA);
      }
    }
    else {
      (pDVar12->base).defInf.dataPtr = (DEV_DATA *)0x0;
      (pDVar12->base).defInf.devDef = (DEV_DEF *)0x0;
    }
    uVar13 = uVar13 + 1;
  } while( true );
}

Assistant:

UINT8 DROPlayer::Start(void)
{
	size_t curDev;
	UINT8 retVal;
	
	for (curDev = 0; curDev < 3; curDev ++)
		_optDevMap[curDev] = (size_t)-1;
	
	_devices.clear();
	_devices.resize(_devTypes.size());
	for (curDev = 0; curDev < _devTypes.size(); curDev ++)
	{
		DRO_CHIPDEV* cDev = &_devices[curDev];
		PLR_DEV_OPTS* devOpts;
		DEV_GEN_CFG* devCfg = &_devCfgs[curDev];
		VGM_BASEDEV* clDev;
		
		cDev->base.defInf.dataPtr = NULL;
		cDev->base.linkDev = NULL;
		cDev->optID = DeviceID2OptionID((UINT32)curDev);
		
		devOpts = (cDev->optID != (size_t)-1) ? &_devOpts[cDev->optID] : NULL;
		devCfg->emuCore = (devOpts != NULL) ? devOpts->emuCore[0] : 0x00;
		devCfg->srMode = (devOpts != NULL) ? devOpts->srMode : DEVRI_SRMODE_NATIVE;
		if (devOpts != NULL && devOpts->smplRate)
			devCfg->smplRate = devOpts->smplRate;
		else
			devCfg->smplRate = _outSmplRate;
		
		retVal = SndEmu_Start(_devTypes[curDev], devCfg, &cDev->base.defInf);
		if (retVal)
		{
			cDev->base.defInf.dataPtr = NULL;
			cDev->base.defInf.devDef = NULL;
			continue;
		}
		SndEmu_GetDeviceFunc(cDev->base.defInf.devDef, RWF_REGISTER | RWF_WRITE, DEVRW_A8D8, 0, (void**)&cDev->write);
		
		cDev->logCbData.player = this;
		cDev->logCbData.chipDevID = curDev;
		if (cDev->base.defInf.devDef->SetLogCB != NULL)
			cDev->base.defInf.devDef->SetLogCB(cDev->base.defInf.dataPtr, DROPlayer::SndEmuLogCB, &cDev->logCbData);
		SetupLinkedDevices(&cDev->base, NULL, NULL);
		
		if (devOpts != NULL)
		{
			if (cDev->base.defInf.devDef->SetOptionBits != NULL)
				cDev->base.defInf.devDef->SetOptionBits(cDev->base.defInf.dataPtr, devOpts->coreOpts);
			
			_optDevMap[cDev->optID] = curDev;
		}
		
		for (clDev = &cDev->base; clDev != NULL; clDev = clDev->linkDev)
		{
			UINT8 resmplMode = (devOpts != NULL) ? devOpts->resmplMode : RSMODE_LINEAR;
			
			if (devOpts != NULL && clDev->defInf.devDef->SetMuteMask != NULL)
				clDev->defInf.devDef->SetMuteMask(clDev->defInf.dataPtr, devOpts->muteOpts.chnMute[0]);
			
			Resmpl_SetVals(&clDev->resmpl, resmplMode, 0x100, _outSmplRate);
			// do DualOPL2 hard panning by muting either the left or right speaker
			if (_devPanning[curDev] & 0x02)
				clDev->resmpl.volumeL = 0x00;
			if (_devPanning[curDev] & 0x01)
				clDev->resmpl.volumeR = 0x00;
			Resmpl_DevConnect(&clDev->resmpl, &clDev->defInf);
			Resmpl_Init(&clDev->resmpl);
		}
	}
	
	_playState |= PLAYSTATE_PLAY;
	Reset();
	if (_eventCbFunc != NULL)
		_eventCbFunc(this, _eventCbParam, PLREVT_START, NULL);
	
	return 0x00;
}